

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real_canvas.hpp
# Opt level: O2

Sizef __thiscall
plot::RealCanvas<plot::BrailleCanvas>::unmap_size
          (RealCanvas<plot::BrailleCanvas> *this,size_type *s)

{
  long lVar1;
  size_t sVar2;
  GenericPoint<float> GVar3;
  Sizef SVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined4 in_XMM3_Db;
  undefined4 uVar13;
  undefined1 auVar7 [16];
  undefined1 auVar11 [16];
  
  GVar3 = GenericRect<float>::size(&this->bounds_);
  sVar2 = (this->canvas_).cols_;
  auVar8._0_8_ = (this->canvas_).lines_ * 4;
  auVar8._8_8_ = sVar2 << 2;
  auVar9._4_12_ = auVar8._4_12_;
  auVar9._0_4_ = (float)s->x;
  lVar1 = sVar2 * 2 + -1;
  uVar13 = (undefined4)((ulong)lVar1 >> 0x20);
  auVar11._0_8_ = auVar9._0_8_;
  auVar11._8_4_ = (int)((ulong)auVar8._0_8_ >> 0x20);
  auVar11._12_4_ = in_XMM3_Db;
  auVar10._8_8_ = auVar11._8_8_;
  auVar10._4_4_ = (float)s->y;
  auVar10._0_4_ = auVar9._0_4_;
  auVar12._8_4_ = (int)lVar1;
  auVar12._0_8_ = lVar1;
  auVar12._12_4_ = uVar13;
  auVar5._4_12_ = auVar12._4_12_;
  auVar5._0_4_ = (float)lVar1;
  auVar7._0_8_ = auVar5._0_8_;
  auVar7._8_4_ = uVar13;
  auVar7._12_4_ = in_XMM3_Db;
  auVar6._8_8_ = auVar7._8_8_;
  auVar6._4_4_ = (float)(auVar8._0_8_ + -1);
  auVar6._0_4_ = auVar5._0_4_;
  auVar12 = divps(auVar10,auVar6);
  SVar4.x = GVar3.x * auVar12._0_4_;
  SVar4.y = GVar3.y * auVar12._4_4_;
  return SVar4;
}

Assistant:

Sizef unmap_size(typename Canvas::size_type const& s) const {
        auto sz = this->size();
        auto canvas_bounds = canvas_.size();
        canvas_bounds -= decltype(canvas_bounds){ 1, 1 };
        return {
            float(s.x)/canvas_bounds.x * sz.x,
            float(s.y)/canvas_bounds.y * sz.y
        };
    }